

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

bool tinyusdz::value::IsRoleType(uint32_t tyid)

{
  uint32_t in_EDX;
  optional<unsigned_int> local_48;
  string local_40;
  
  GetTypeName_abi_cxx11_(&local_40,(value *)(ulong)tyid,in_EDX);
  TryGetUnderlyingTypeId(&local_48,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return (bool)(local_48.has_value_ & local_48.contained != (storage_t<unsigned_int>)0x0);
}

Assistant:

bool IsRoleType(const uint32_t tyid) {
  return GetUnderlyingTypeId(GetTypeName(tyid)) != value::TYPE_ID_INVALID;
}